

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

Mat * ncnn::Mat::from_float16(Mat *__return_storage_ptr__,unsigned_short *data,int size)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  void *pvVar4;
  uint *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->elemsize = 4;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 1;
  __return_storage_ptr__->w = size;
  __return_storage_ptr__->h = 1;
  __return_storage_ptr__->c = 1;
  sVar9 = (size_t)size;
  __return_storage_ptr__->cstep = sVar9;
  if (size != 0) {
    pvVar4 = malloc(sVar9 * 4 + 0x1c);
    puVar5 = (uint *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
    *(void **)(puVar5 + -2) = pvVar4;
    __return_storage_ptr__->data = puVar5;
    __return_storage_ptr__->refcount = (int *)(puVar5 + sVar9);
    puVar5[sVar9] = 1;
    if (0 < size) {
      do {
        uVar1 = *data;
        uVar3 = (uint)(uVar1 >> 0xf);
        uVar8 = uVar1 >> 10 & 0x1f;
        if (uVar8 == 0x1f) {
          uVar3 = (uint)uVar1 << 0xd | uVar3 << 0x1f | 0x7f800000;
        }
        else {
          uVar6 = uVar1 & 0x3ff;
          if ((uVar1 >> 10 & 0x1f) == 0) {
            if ((short)uVar6 == 0) {
              uVar3 = uVar3 << 0x1f;
            }
            else {
              uVar8 = 0x38000000;
              if ((uVar1 >> 9 & 1) == 0) {
                iVar7 = 0;
                do {
                  iVar7 = iVar7 + 1;
                  uVar8 = uVar6 >> 8;
                  uVar6 = uVar6 * 2;
                } while ((uVar8 & 1) == 0);
                uVar8 = iVar7 * -0x800000 + 0x38000000;
              }
              uVar3 = (uVar6 * 2 & 0x3fe) * 0x2000 + (uVar3 << 0x1f | uVar8);
            }
          }
          else {
            uVar3 = uVar6 * 0x2000 + (uVar8 << 0x17 | uVar3 << 0x1f) + 0x38000000;
          }
        }
        *puVar5 = uVar3;
        data = data + 1;
        puVar5 = puVar5 + 1;
        bVar2 = 1 < size;
        size = size + -1;
      } while (bVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat m(size);
    if (m.empty())
        return m;

    float* ptr = m;//.data;

#if __ARM_NEON && (__ARM_FP & 2)
    int nn = cpu_support_arm_vfpv4() ? size >> 2 : 0;
    int remain = size - (nn << 2);
#else
    int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON && (__ARM_FP & 2)
#if __aarch64__
    if (nn > 0)
    {
    asm volatile(
        "0:                             \n"
        "ld1    {v0.4h}, [%1], #8       \n"
        "fcvtl  v1.4s, v0.4h            \n"
        "subs   %w0, %w0, #1            \n"
        "st1    {v1.4s}, [%2], #16      \n"
        "bne    0b                      \n"
        : "=r"(nn),     // %0
          "=r"(data),   // %1
          "=r"(ptr)     // %2
        : "0"(nn),
          "1"(data),
          "2"(ptr)
        : "cc", "memory", "v0", "v1"
    );
    }
#else
    if (nn > 0)
    {
    asm volatile(
        "0:                             \n"
        "pld        [%1, #64]           \n"
        "vld1.s16   {d0}, [%1 :64]!     \n"
        "vcvt.f32.f16 q1, d0            \n"
        "subs       %0, #1              \n"
        "vst1.f32   {d2-d3}, [%2 :128]! \n"
        "bne        0b                  \n"
        : "=r"(nn),     // %0
          "=r"(data),   // %1
          "=r"(ptr)     // %2
        : "0"(nn),
          "1"(data),
          "2"(ptr)
        : "cc", "memory", "q0", "q1"
    );
    }
#endif // __aarch64__
#endif // __ARM_NEON
    for (; remain>0; remain--)
    {
        *ptr = half2float(*data);

        data++;
        ptr++;
    }

    return m;
}